

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_t.cpp
# Opt level: O0

void __thiscall deci::string_t::string_t(string_t *this,string *copy)

{
  string *copy_local;
  string_t *this_local;
  
  value_t::value_t(&this->super_value_t);
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0013a8c0;
  std::__cxx11::string::string((string *)&this->val,(string *)copy);
  return;
}

Assistant:

string_t::string_t(const std::string& copy):value_t(),val(copy) {
      ;
    }